

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_AddingExistingWithCaseAfter2_Test::TestBody(TApp_AddingExistingWithCaseAfter2_Test *this)

{
  bool bVar1;
  Option *this_00;
  App *this_01;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"-c,--count",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_a0);
  this_01 = &(this->super_TApp).app;
  CLI::App::add_flag(this_01,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"--Cat,-C",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_a0);
  this_00 = CLI::App::add_flag(this_01,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CLI::Option::ignore_case<CLI::App>(this_00,true);
  }
  testing::Message::Message((Message *)&local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x2d,
             "Expected: cat->ignore_case() throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_98);
  return;
}

Assistant:

TEST_F(TApp, AddingExistingWithCaseAfter2) {
    app.add_flag("-c,--count");
    auto cat = app.add_flag("--Cat,-C");

    EXPECT_THROW(cat->ignore_case(), CLI::OptionAlreadyAdded);
}